

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * kname(Proto *p,int index,char **name)

{
  lua_CFunction p_Var1;
  char *pcVar2;
  code *pcVar3;
  
  if ((p->k[(uint)index].tt_ & 0xf) == 4) {
    p_Var1 = p->k[(uint)index].value_.f;
    pcVar3 = p_Var1 + 0x18;
    pcVar2 = "constant";
    if ((char)p_Var1[0xb] < '\0') {
      pcVar3 = *(code **)pcVar3;
    }
  }
  else {
    pcVar3 = (code *)0x126a06;
    pcVar2 = (char *)0x0;
  }
  *name = (char *)pcVar3;
  return pcVar2;
}

Assistant:

static const char *kname (const Proto *p, int index, const char **name) {
  TValue *kvalue = &p->k[index];
  if (ttisstring(kvalue)) {
    *name = getstr(tsvalue(kvalue));
    return "constant";
  }
  else {
    *name = "?";
    return NULL;
  }
}